

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

SBuf * lj_buf_putstr_rep(SBuf *sb,GCstr *s,int32_t rep)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  int in_EDX;
  char *pcVar4;
  char *pcVar5;
  long in_RSI;
  SBuf *in_RDI;
  char *q;
  char *e;
  uint32_t c;
  char *p;
  uint64_t tlen;
  MSize len;
  undefined8 in_stack_ffffffffffffffa8;
  SBuf *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *local_40;
  int local_2c;
  char *local_8;
  
  uVar2 = *(uint *)(in_RSI + 0xc);
  if ((0 < in_EDX) && (uVar2 != 0)) {
    if (0x7fffff00 < (long)in_EDX * (ulong)uVar2) {
      lj_err_mem((lua_State *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    if ((in_RDI->e).ptr32 - (in_RDI->p).ptr32 < (uint)((long)in_EDX * (ulong)uVar2)) {
      local_8 = lj_buf_more2(in_stack_ffffffffffffffb0,
                             (MSize)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    else {
      local_8 = (char *)(ulong)(in_RDI->p).ptr32;
    }
    local_40 = local_8;
    local_2c = in_EDX;
    if (uVar2 == 1) {
      cVar1 = *(char *)(in_RSI + 0x10);
      do {
        pcVar4 = local_40 + 1;
        *local_40 = cVar1;
        local_2c = local_2c + -1;
        local_40 = pcVar4;
      } while (0 < local_2c);
    }
    else {
      do {
        pcVar4 = (char *)(in_RSI + 0x10);
        do {
          pcVar3 = pcVar4 + 1;
          pcVar5 = local_40 + 1;
          *local_40 = *pcVar4;
          pcVar4 = pcVar3;
          local_40 = pcVar5;
        } while (pcVar3 < (char *)(in_RSI + 0x10 + (ulong)uVar2));
        local_2c = local_2c + -1;
      } while (0 < local_2c);
    }
    (in_RDI->p).ptr32 = (uint32_t)local_40;
  }
  return in_RDI;
}

Assistant:

SBuf *lj_buf_putstr_rep(SBuf *sb, GCstr *s, int32_t rep)
{
  MSize len = s->len;
  if (rep > 0 && len) {
    uint64_t tlen = (uint64_t)rep * len;
    char *p;
    if (LJ_UNLIKELY(tlen > LJ_MAX_STR))
      lj_err_mem(sbufL(sb));
    p = lj_buf_more(sb, (MSize)tlen);
    if (len == 1) {  /* Optimize a common case. */
      uint32_t c = strdata(s)[0];
      do { *p++ = c; } while (--rep > 0);
    } else {
      const char *e = strdata(s) + len;
      do {
	const char *q = strdata(s);
	do { *p++ = *q++; } while (q < e);
      } while (--rep > 0);
    }
    setsbufP(sb, p);
  }
  return sb;
}